

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.c
# Opt level: O0

double cpu_idle_func(void)

{
  char *__nptr;
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  sensor_slurp proc_stat;
  char *p;
  char *in_stack_ffffffffffffdff0;
  
  memcpy(&stack0xffffffffffffdff0,&PTR_anon_var_dwarf_2a827_00188ae0,0x2008);
  update_file((sensor_slurp *)0x1505fa);
  skip_token(in_stack_ffffffffffffdff0);
  skip_token(in_stack_ffffffffffffdff0);
  skip_token(in_stack_ffffffffffffdff0);
  __nptr = skip_token(in_stack_ffffffffffffdff0);
  cpu_idle_func::idle_jiffies = strtod(__nptr,(char **)0x0);
  uVar1 = total_jiffies_func();
  auVar2._8_4_ = (int)(uVar1 >> 0x20);
  auVar2._0_8_ = uVar1;
  auVar2._12_4_ = 0x45300000;
  cpu_idle_func::total_jiffies =
       (auVar2._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  cpu_idle_func::diff = cpu_idle_func::idle_jiffies - cpu_idle_func::last_idle_jiffies;
  if ((cpu_idle_func::diff != 0.0) || (NAN(cpu_idle_func::diff))) {
    cpu_idle_func::val =
         (cpu_idle_func::diff / (cpu_idle_func::total_jiffies - cpu_idle_func::last_total_jiffies))
         * 100.0;
  }
  else {
    cpu_idle_func::val = 0.0;
  }
  cpu_idle_func::last_idle_jiffies = cpu_idle_func::idle_jiffies;
  cpu_idle_func::last_total_jiffies = cpu_idle_func::total_jiffies;
  return cpu_idle_func::val;
}

Assistant:

double cpu_idle_func ( void )
{
    char *p;
    static double val; 
    static double last_idle_jiffies,  idle_jiffies,
	last_total_jiffies, total_jiffies, diff;
									   
      sensor_slurp proc_stat    = { "/proc/stat" };
    p = update_file(&proc_stat);
		      
    p = skip_token(p);
    p = skip_token(p);
    p = skip_token(p);
    p = skip_token(p);
    idle_jiffies  = strtod( p , (char **)NULL );
    total_jiffies = (double) total_jiffies_func();
		 
    diff = idle_jiffies - last_idle_jiffies;

    if ( diff ) 
	val = (diff/(total_jiffies - last_total_jiffies))*100;
    else 
	val = 0.0; 
    last_idle_jiffies = idle_jiffies;
    last_total_jiffies = total_jiffies;
    return val; 
}